

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

uint mg_init_library(uint features)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_t __size;
  char *pcVar4;
  long lVar5;
  size_t sVar6;
  char *__src;
  
  if ((mg_init_library_called < 1) &&
     (iVar2 = pthread_mutex_init((pthread_mutex_t *)&global_lock_mutex,(pthread_mutexattr_t *)0x0),
     iVar2 != 0)) {
    return 0;
  }
  pthread_mutex_lock((pthread_mutex_t *)&global_lock_mutex);
  if (0 < mg_init_library_called) {
LAB_00117c86:
    iVar2 = mg_init_library_called + 1;
    bVar1 = 0 < mg_init_library_called;
    mg_init_library_called = 1;
    if (bVar1) {
      mg_init_library_called = iVar2;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&global_lock_mutex);
    return features & 8;
  }
  iVar2 = pthread_key_create(&sTlsKey,tls_dtor);
  if (iVar2 == 0) {
    iVar2 = pthread_mutexattr_init((pthread_mutexattr_t *)&pthread_mutex_attr);
    if (iVar2 == 0) {
      iVar2 = pthread_mutexattr_settype((pthread_mutexattr_t *)&pthread_mutex_attr,1);
      if (iVar2 == 0) {
        sVar6 = 1;
        pcVar4 = "GET";
        lVar5 = 0;
        do {
          sVar3 = strlen(pcVar4);
          __size = sVar3 + sVar6 + 2;
          sVar6 = sVar6 + sVar3;
          if (lVar5 != 0) {
            sVar6 = __size;
          }
          pcVar4 = *(char **)((long)&http_methods[1].name + lVar5);
          lVar5 = lVar5 + 0x20;
        } while (lVar5 != 0x200);
        pcVar4 = (char *)malloc(__size);
        all_methods = pcVar4;
        if (pcVar4 != (char *)0x0) {
          *pcVar4 = '\0';
          __src = "GET";
          lVar5 = 0;
          do {
            if (lVar5 == 0) {
              strcpy(pcVar4,__src);
            }
            else {
              sVar6 = strlen(pcVar4);
              (pcVar4 + sVar6)[0] = ',';
              (pcVar4 + sVar6)[1] = ' ';
              pcVar4[sVar6 + 2] = '\0';
              strcat(pcVar4,__src);
            }
            __src = *(char **)((long)&http_methods[1].name + lVar5);
            lVar5 = lVar5 + 0x20;
          } while (lVar5 != 0x200);
          goto LAB_00117c86;
        }
        goto LAB_00117d1a;
      }
      pthread_mutexattr_destroy((pthread_mutexattr_t *)&pthread_mutex_attr);
    }
    pthread_key_delete(sTlsKey);
  }
LAB_00117d1a:
  pthread_mutex_unlock((pthread_mutex_t *)&global_lock_mutex);
  pthread_mutex_destroy((pthread_mutex_t *)&global_lock_mutex);
  return 0;
}

Assistant:

CIVETWEB_API unsigned
mg_init_library(unsigned features)
{
	unsigned features_to_init = mg_check_feature(features & 0xFFu);
	unsigned features_inited = features_to_init;

	if (mg_init_library_called <= 0) {
		/* Not initialized yet */
		if (0 != pthread_mutex_init(&global_lock_mutex, NULL)) {
			return 0;
		}
	}

	mg_global_lock();

	if (mg_init_library_called <= 0) {
		int i;
		size_t len;

#if defined(_WIN32)
		int file_mutex_init = 1;
		int wsa = 1;
#else
		int mutexattr_init = 1;
#endif
		int failed = 1;
		int key_create = pthread_key_create(&sTlsKey, tls_dtor);

		if (key_create == 0) {
#if defined(_WIN32)
			file_mutex_init =
			    pthread_mutex_init(&global_log_file_lock, &pthread_mutex_attr);
			if (file_mutex_init == 0) {
				/* Start WinSock */
				WSADATA data;
				failed = wsa = WSAStartup(MAKEWORD(2, 2), &data);
			}
#else
			mutexattr_init = pthread_mutexattr_init(&pthread_mutex_attr);
			if (mutexattr_init == 0) {
				failed = pthread_mutexattr_settype(&pthread_mutex_attr,
				                                   PTHREAD_MUTEX_RECURSIVE);
			}
#endif
		}

		if (failed) {
#if defined(_WIN32)
			if (wsa == 0) {
				(void)WSACleanup();
			}
			if (file_mutex_init == 0) {
				(void)pthread_mutex_destroy(&global_log_file_lock);
			}
#else
			if (mutexattr_init == 0) {
				(void)pthread_mutexattr_destroy(&pthread_mutex_attr);
			}
#endif
			if (key_create == 0) {
				(void)pthread_key_delete(sTlsKey);
			}
			mg_global_unlock();
			(void)pthread_mutex_destroy(&global_lock_mutex);
			return 0;
		}

		len = 1;
		for (i = 0; http_methods[i].name != NULL; i++) {
			size_t sl = strlen(http_methods[i].name);
			len += sl;
			if (i > 0) {
				len += 2;
			}
		}
		all_methods = (char *)mg_malloc(len);
		if (!all_methods) {
			/* Must never happen */
			mg_global_unlock();
			(void)pthread_mutex_destroy(&global_lock_mutex);
			return 0;
		}
		all_methods[0] = 0;
		for (i = 0; http_methods[i].name != NULL; i++) {
			if (i > 0) {
				strcat(all_methods, ", ");
				strcat(all_methods, http_methods[i].name);
			} else {
				strcpy(all_methods, http_methods[i].name);
			}
		}
	}

#if defined(USE_LUA)
	lua_init_optional_libraries();
#endif

#if (defined(OPENSSL_API_1_0) || defined(OPENSSL_API_1_1)                      \
     || defined(OPENSSL_API_3_0))                                              \
    && !defined(NO_SSL)

	if (features_to_init & MG_FEATURES_SSL) {
		if (!mg_openssl_initialized) {
			char ebuf[128];
			if (initialize_openssl(ebuf, sizeof(ebuf))) {
				mg_openssl_initialized = 1;
			} else {
				(void)ebuf;
				DEBUG_TRACE("Initializing SSL failed: %s", ebuf);
				features_inited &= ~((unsigned)(MG_FEATURES_SSL));
			}
		} else {
			/* ssl already initialized */
		}
	}

#endif

	if (mg_init_library_called <= 0) {
		mg_init_library_called = 1;
	} else {
		mg_init_library_called++;
	}
	mg_global_unlock();

	return features_inited;
}